

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O0

String * kj::_::operator*(String *__return_storage_ptr__,String *param_2,undefined8 param_3,
                         undefined8 param_4,ArrayPtr<const_char> *param_5)

{
  String *pSVar1;
  ArrayPtr<const_char> local_40;
  ArrayPtr<const_char> local_30;
  String *local_20;
  DebugComparison<kj::String,_const_char_(&)[9]> *cmp_local;
  String *local_10;
  
  local_20 = param_2;
  local_10 = __return_storage_ptr__;
  local_30 = tryToCharSequence<kj::String,kj::ArrayPtr<char_const>>(param_2);
  pSVar1 = local_20 + 1;
  local_40 = tryToCharSequence<char_const[9],kj::ArrayPtr<char_const>>
                       ((char (*) [9])local_20[1].content.ptr);
  concat<kj::ArrayPtr<char_const>,kj::StringPtr&,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_30,(ArrayPtr<const_char> *)&(pSVar1->content).size_,
             (StringPtr *)&local_40,param_5);
  return __return_storage_ptr__;
}

Assistant:

String KJ_STRINGIFY(DebugComparison<Left, Right>& cmp) {
  return _::concat(tryToCharSequence(&cmp.left), cmp.op, tryToCharSequence(&cmp.right));
}